

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaNf.c
# Opt level: O0

void Nf_ManElaBestMatch(Nf_Man_t *p,int iObj,int c,Nf_Mat_t *pRes,int Required)

{
  int iVar1;
  int iVar2;
  int *pCutSet_00;
  int *pCutSet;
  int *pCut;
  int k;
  int Required_local;
  Nf_Mat_t *pRes_local;
  int c_local;
  int iObj_local;
  Nf_Man_t *p_local;
  
  pCutSet_00 = Nf_ObjCutSet(p,iObj);
  memset(pRes,0,0x10);
  pRes->D = 0x3fffffff;
  pRes->F = 3.4028235e+38;
  pCut._0_4_ = 0;
  pCutSet = pCutSet_00 + 1;
  while ((int)pCut < *pCutSet_00) {
    iVar1 = Nf_CutFunc(pCutSet);
    iVar1 = Abc_Lit2Var(iVar1);
    iVar2 = Vec_WecSize(p->vTt2Match);
    if (iVar1 < iVar2) {
      Nf_ManElaBestMatchOne(p,iObj,c,pCutSet,pCutSet_00,pRes,Required);
    }
    pCut._0_4_ = (int)pCut + 1;
    iVar1 = Nf_CutSize(pCutSet);
    pCutSet = pCutSet + (iVar1 + 1);
  }
  return;
}

Assistant:

void Nf_ManElaBestMatch( Nf_Man_t * p, int iObj, int c, Nf_Mat_t * pRes, int Required )
{
    int k, * pCut, * pCutSet = Nf_ObjCutSet( p, iObj );
    memset( pRes, 0, sizeof(Nf_Mat_t) );
    pRes->D = SCL_INFINITY; pRes->F = FLT_MAX;
    Nf_SetForEachCut( pCutSet, pCut, k )
    {
        if ( Abc_Lit2Var(Nf_CutFunc(pCut)) >= Vec_WecSize(p->vTt2Match) )
            continue;
        Nf_ManElaBestMatchOne( p, iObj, c, pCut, pCutSet, pRes, Required );
    }
}